

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_linear_resampler_get_expected_output_frame_count
                    (ma_linear_resampler *pResampler,ma_uint64 inputFrameCount,
                    ma_uint64 *pOutputFrameCount)

{
  ma_uint64 preliminaryInputFrameCount;
  ma_uint64 preliminaryInputFrameCountFromFrac;
  ma_uint64 outputFrameCount;
  ma_uint64 *pOutputFrameCount_local;
  ma_uint64 inputFrameCount_local;
  ma_linear_resampler *pResampler_local;
  
  if (pOutputFrameCount == (ma_uint64 *)0x0) {
    pResampler_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pOutputFrameCount = 0;
    if (pResampler == (ma_linear_resampler *)0x0) {
      pResampler_local._4_4_ = MA_INVALID_ARGS;
    }
    else {
      preliminaryInputFrameCountFromFrac =
           (inputFrameCount * (pResampler->config).sampleRateOut) /
           (ulong)(pResampler->config).sampleRateIn;
      if ((ulong)pResampler->inTimeInt +
          preliminaryInputFrameCountFromFrac * pResampler->inAdvanceInt +
          ((ulong)pResampler->inTimeFrac +
          preliminaryInputFrameCountFromFrac * pResampler->inAdvanceFrac) /
          (ulong)(pResampler->config).sampleRateOut <= inputFrameCount) {
        preliminaryInputFrameCountFromFrac = preliminaryInputFrameCountFromFrac + 1;
      }
      *pOutputFrameCount = preliminaryInputFrameCountFromFrac;
      pResampler_local._4_4_ = MA_SUCCESS;
    }
  }
  return pResampler_local._4_4_;
}

Assistant:

MA_API ma_result ma_linear_resampler_get_expected_output_frame_count(const ma_linear_resampler* pResampler, ma_uint64 inputFrameCount, ma_uint64* pOutputFrameCount)
{
    ma_uint64 outputFrameCount;
    ma_uint64 preliminaryInputFrameCountFromFrac;
    ma_uint64 preliminaryInputFrameCount;

    if (pOutputFrameCount == NULL) {
        return MA_INVALID_ARGS;
    }

    *pOutputFrameCount = 0;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    /*
    The first step is to get a preliminary output frame count. This will either be exactly equal to what we need, or less by 1. We need to
    determine how many input frames will be consumed by this value. If it's greater than our original input frame count it means we won't
    be able to generate an extra frame because we will have run out of input data. Otherwise we will have enough input for the generation
    of an extra output frame. This add-by-one logic is necessary due to how the data loading logic works when processing frames.
    */
    outputFrameCount = (inputFrameCount * pResampler->config.sampleRateOut) / pResampler->config.sampleRateIn;

    /*
    We need to determine how many *whole* input frames will have been processed to generate our preliminary output frame count. This is
    used in the logic below to determine whether or not we need to add an extra output frame.
    */
    preliminaryInputFrameCountFromFrac = (pResampler->inTimeFrac + outputFrameCount*pResampler->inAdvanceFrac) / pResampler->config.sampleRateOut;
    preliminaryInputFrameCount         = (pResampler->inTimeInt  + outputFrameCount*pResampler->inAdvanceInt ) + preliminaryInputFrameCountFromFrac;

    /*
    If the total number of *whole* input frames that would be required to generate our preliminary output frame count is greather than
    the amount of whole input frames we have available as input we need to *not* add an extra output frame as there won't be enough data
    to actually process. Otherwise we need to add the extra output frame.
    */
    if (preliminaryInputFrameCount <= inputFrameCount) {
        outputFrameCount += 1;
    }

    *pOutputFrameCount = outputFrameCount;

    return MA_SUCCESS;
}